

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

int __thiscall Fl_Tree::handle(Fl_Tree *this,int e)

{
  Fl_Tree_Prefs *prefs;
  byte bVar1;
  Fl_Tree_Select FVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Fl_Tree_Item *pFVar6;
  Fl_Tree_Item *pFVar7;
  Fl_Tree_Item *from;
  fd_set *in_RCX;
  fd_set *__writefds;
  int iVar8;
  uint uVar9;
  int iVar10;
  fd_set *in_R8;
  timeval *in_R9;
  uint uVar11;
  
  iVar8 = Fl::e_state;
  if (e == 0) {
    return 0;
  }
  if (e - 3U < 2) {
    return 1;
  }
  uVar9 = (uint)Fl::e_state >> 0x10;
  uVar11 = (uint)Fl::e_state >> 0x12;
  if (e != 8) {
    if (e != 7) {
      if (e != 6) goto LAB_001d848a;
      if (this->_item_focus == (Fl_Tree_Item *)0x0) {
        if (Fl::e_keysym - 0xff51U < 2) {
          iVar8 = 0xff52;
        }
        else if (Fl::e_keysym == 0xff09) {
          iVar8 = (uint)((uVar9 & 1) == 0) * 2 + 0xff52;
        }
        else {
          iVar8 = 0xff54;
        }
        pFVar7 = next_item(this,(Fl_Tree_Item *)0x0,iVar8,true);
        if ((this->_item_focus != pFVar7) &&
           (this->_item_focus = pFVar7, ((this->super_Fl_Group).super_Fl_Widget.flags_ & 0x200) != 0
           )) {
          Fl_Widget::redraw((Fl_Widget *)this);
        }
      }
    }
    if (((this->super_Fl_Group).super_Fl_Widget.flags_ & 0x200) == 0) {
      return 1;
    }
    goto LAB_001d8470;
  }
  if (((Fl_Tree *)Fl::focus_ == this) && (0 < (int)(this->_prefs)._selectmode)) {
    pFVar7 = this->_item_focus;
    if (pFVar7 == (Fl_Tree_Item *)0x0) {
      pFVar7 = first_visible_item(this);
      if ((this->_item_focus != pFVar7) &&
         (this->_item_focus = pFVar7, ((this->super_Fl_Group).super_Fl_Widget.flags_ & 0x200) != 0))
      {
        Fl_Widget::redraw((Fl_Widget *)this);
      }
      if (Fl::e_keysym == 0xff52) {
        return 1;
      }
      if (Fl::e_keysym == 0xff54) {
        return 1;
      }
      pFVar7 = this->_item_focus;
      if (pFVar7 == (Fl_Tree_Item *)0x0) goto LAB_001d848a;
    }
    if (Fl::e_keysym < 0xff0d) {
      if (Fl::e_keysym == 0x20) {
        FVar2 = (this->_prefs)._selectmode;
        if (FVar2 != FL_TREE_SELECT_SINGLE_DRAGGABLE) {
          if (FVar2 == FL_TREE_SELECT_MULTI) {
            bVar1 = (this->super_Fl_Group).super_Fl_Widget.when_;
            if ((uVar11 & 1) == 0) {
              select(this,(int)pFVar7,(fd_set *)(ulong)bVar1,in_RCX,in_R8,in_R9);
            }
            else {
              select_toggle(this,pFVar7,(uint)bVar1);
            }
            goto LAB_001d8bd8;
          }
          if (FVar2 != FL_TREE_SELECT_SINGLE) goto LAB_001d848a;
        }
        if ((uVar11 & 1) == 0) {
          bVar1 = (this->super_Fl_Group).super_Fl_Widget.when_;
        }
        else {
          bVar1 = (this->super_Fl_Group).super_Fl_Widget.when_;
          if (pFVar7->_selected != '\0') {
            deselect_all(this,(Fl_Tree_Item *)0x0,(uint)bVar1);
            goto LAB_001d8bd8;
          }
        }
        select_only(this,pFVar7,(uint)bVar1);
LAB_001d8bd8:
        handle::_lastselect = this->_item_focus;
        return 1;
      }
      if ((((Fl::e_keysym == 0x41) || (Fl::e_keysym == 0x61)) && (((uint)iVar8 >> 0x12 & 1) != 0))
         && ((this->_prefs)._selectmode == FL_TREE_SELECT_MULTI)) {
        select_all(this,(Fl_Tree_Item *)0x0,1);
        handle::_lastselect = first_visible_item(this);
        Fl_Widget::take_focus((Fl_Widget *)this);
        return 1;
      }
    }
    else {
      switch(Fl::e_keysym) {
      case 0xff51:
        if (pFVar7->_open != '\0') {
          close(this,(int)pFVar7);
          return 1;
        }
        return 1;
      case 0xff52:
      case 0xff54:
        in_RCX = (fd_set *)&DAT_00000001;
        pFVar6 = next_item(this,pFVar7,Fl::e_keysym,true);
        pFVar7 = this->_item_focus;
        if ((this->_item_focus != pFVar6) &&
           (this->_item_focus = pFVar6, pFVar7 = pFVar6,
           ((this->super_Fl_Group).super_Fl_Widget.flags_ & 0x200) != 0)) {
          Fl_Widget::redraw((Fl_Widget *)this);
          pFVar7 = this->_item_focus;
        }
        if (pFVar7 != (Fl_Tree_Item *)0x0) {
          uVar11 = pFVar7->_xywh[1];
          __writefds = (fd_set *)(ulong)uVar11;
          iVar8 = pFVar7->_xywh[3];
          iVar4 = (this->super_Fl_Group).super_Fl_Widget.y_;
          if ((int)uVar11 < iVar4) {
            show_item(this,pFVar7,0);
            iVar4 = (this->super_Fl_Group).super_Fl_Widget.y_;
          }
          if (iVar4 + (this->super_Fl_Group).super_Fl_Widget.h_ < (int)(iVar8 + uVar11)) {
            show_item_bottom(this,this->_item_focus);
          }
          if ((uVar9 & 1) == 0) {
            return 1;
          }
          if ((this->_prefs)._selectmode != FL_TREE_SELECT_MULTI) {
            return 1;
          }
          if (this->_item_focus->_selected == '\0') {
            select(this,(int)this->_item_focus,
                   (fd_set *)(ulong)(this->super_Fl_Group).super_Fl_Widget.when_,__writefds,in_R8,
                   in_R9);
            handle::_lastselect = this->_item_focus;
            return 1;
          }
          return 1;
        }
        break;
      case 0xff53:
        if (pFVar7->_open == '\0') {
          open(this,(char *)pFVar7,1);
          return 1;
        }
        return 1;
      default:
        if ((Fl::e_keysym == 0xff8d) || (Fl::e_keysym == 0xff0d)) {
          open_toggle(this,pFVar7,(uint)(this->super_Fl_Group).super_Fl_Widget.when_);
          return 1;
        }
      }
    }
  }
LAB_001d848a:
  iVar4 = Fl_Group::handle(&this->super_Fl_Group,e);
  iVar8 = handle::last_my;
  if (iVar4 != 0) {
    return 1;
  }
  if (this->_root == (Fl_Tree_Item *)0x0) {
    return 0;
  }
  if (e != 5) {
    if (e == 2) {
      if ((this->_prefs)._selectmode != FL_TREE_SELECT_SINGLE_DRAGGABLE) {
        return 1;
      }
      if (Fl::e_keysym != 0xfee9) {
        return 1;
      }
      pFVar7 = Fl_Tree_Item::find_clicked(this->_root,&this->_prefs);
      if ((((pFVar7 != (Fl_Tree_Item *)0x0) && (handle::_lastselect != (Fl_Tree_Item *)0x0)) &&
          (pFVar7 != handle::_lastselect)) && (pFVar7->_label_xywh[0] <= Fl::e_x)) {
        iVar8 = Fl::e_y - pFVar7->_xywh[1];
        iVar4 = pFVar7->_xywh[3] / 2;
        if (iVar8 < iVar4) {
          pFVar6 = Fl_Tree_Item::prev(pFVar7);
        }
        else {
          pFVar6 = Fl_Tree_Item::next(pFVar7);
        }
        if ((pFVar6 != handle::_lastselect) &&
           (pFVar6 = pFVar7->_parent, pFVar6 != (Fl_Tree_Item *)0x0)) {
          iVar5 = Fl_Tree_Item::find_child(pFVar6,pFVar7);
          iVar10 = (uint)(iVar4 <= iVar8) + iVar5;
          if (((pFVar7->_children)._total != 0) &&
             ((pFVar7->_open != '\0' && (iVar10 = iVar5, iVar4 <= iVar8)))) {
            iVar10 = 0;
            pFVar6 = pFVar7;
          }
          if (handle::_lastselect->_parent == pFVar6) {
            if (iVar8 < iVar4) {
              Fl_Tree_Item::move_above(handle::_lastselect,pFVar7);
            }
            else {
              Fl_Tree_Item::move_below(handle::_lastselect,pFVar7);
            }
          }
          else {
            Fl_Tree_Item::move_into(handle::_lastselect,pFVar6,iVar10);
          }
          Fl_Widget::redraw((Fl_Widget *)this);
          pFVar7 = handle::_lastselect;
          this->_callback_reason = FL_TREE_REASON_DRAGGED;
          this->_callback_item = pFVar7;
          Fl_Widget::do_callback
                    ((Fl_Widget *)this,(Fl_Widget *)this,
                     (this->super_Fl_Group).super_Fl_Widget.user_data_);
        }
      }
LAB_001d8470:
      Fl_Widget::redraw((Fl_Widget *)this);
      return 1;
    }
    if (e != 1) {
      return 0;
    }
    handle::last_my = Fl::e_y;
    bVar3 = Fl::option(OPTION_VISIBLE_FOCUS);
    if ((bVar3) &&
       (iVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6), iVar8 != 0)) {
      Fl::focus((Fl_Widget *)this);
    }
    prefs = &this->_prefs;
    pFVar7 = Fl_Tree_Item::find_clicked(this->_root,prefs);
    if (pFVar7 == (Fl_Tree_Item *)0x0) {
      handle::_lastselect = (Fl_Tree_Item *)0x0;
      if ((this->_prefs)._selectmode - FL_TREE_SELECT_SINGLE < 3) {
        deselect_all(this,(Fl_Tree_Item *)0x0,1);
        return 0;
      }
      handle::_lastselect = (Fl_Tree_Item *)0x0;
      return 0;
    }
    if ((this->_item_focus != pFVar7) &&
       (this->_item_focus = pFVar7, ((this->super_Fl_Group).super_Fl_Widget.flags_ & 0x200) != 0)) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    if (Fl::e_keysym != 0xfee9) {
      return 1;
    }
    iVar8 = Fl_Tree_Item::event_on_collapse_icon(pFVar7,prefs);
    if (iVar8 != 0) {
      open_toggle(this,pFVar7,1);
      return 1;
    }
    iVar8 = Fl_Tree_Item::event_on_label(pFVar7,prefs);
    if (iVar8 == 0) {
      return 1;
    }
    if ((pFVar7->_widget != (Fl_Widget *)0x0) &&
       (iVar8 = Fl::event_inside(pFVar7->_widget), iVar8 != 0)) {
      return 1;
    }
    FVar2 = (this->_prefs)._selectmode;
    if (FVar2 != FL_TREE_SELECT_SINGLE_DRAGGABLE) {
      if (FVar2 == FL_TREE_SELECT_MULTI) {
        if ((uVar9 & 1) != 0) {
          if (handle::_lastselect == (Fl_Tree_Item *)0x0) {
            select(this,(int)pFVar7,(fd_set *)&DAT_00000001,in_RCX,in_R8,in_R9);
            handle::_lastselect = pFVar7;
            return 1;
          }
          extend_selection__(this,handle::_lastselect,pFVar7,((byte)uVar11 & 1) + 1,true);
          handle::_lastselect = pFVar7;
          return 1;
        }
        uVar9 = (uint)(this->super_Fl_Group).super_Fl_Widget.when_;
        if ((uVar11 & 1) != 0) {
          select_toggle(this,pFVar7,uVar9);
          handle::_lastselect = pFVar7;
          return 1;
        }
        goto LAB_001d8ad1;
      }
      if (FVar2 != FL_TREE_SELECT_SINGLE) {
        return 1;
      }
    }
    uVar9 = (uint)(this->super_Fl_Group).super_Fl_Widget.when_;
LAB_001d8ad1:
    select_only(this,pFVar7,uVar9);
    handle::_lastselect = pFVar7;
    return 1;
  }
  handle::last_my = Fl::e_y;
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.y_;
  if (Fl::e_y < iVar4) {
    iVar8 = (Fl::e_y - iVar4) + (int)(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.value_;
    iVar10 = 0;
    if (0 < iVar8) {
      iVar10 = iVar8;
    }
    iVar8 = 0xff52;
  }
  else {
    iVar4 = iVar4 + (this->super_Fl_Group).super_Fl_Widget.h_;
    iVar10 = Fl::e_y - iVar4;
    if (iVar10 == 0 || Fl::e_y < iVar4) {
      iVar8 = (uint)(iVar8 < Fl::e_y) * 2 + 0xff52;
      goto LAB_001d8963;
    }
    iVar10 = iVar10 + (int)(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.value_;
    iVar8 = (int)(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.max;
    if (iVar8 <= iVar10) {
      iVar10 = iVar8;
    }
    iVar8 = 0xff54;
  }
  vposition(this,iVar10);
LAB_001d8963:
  if (Fl::e_keysym != 0xfee9) {
    return 0;
  }
  pFVar7 = Fl_Tree_Item::find_clicked(this->_root,&this->_prefs);
  if (pFVar7 != (Fl_Tree_Item *)0x0) {
    if ((((this->_prefs)._selectmode != FL_TREE_SELECT_SINGLE_DRAGGABLE) &&
        (this->_item_focus != pFVar7)) &&
       (this->_item_focus = pFVar7, ((this->super_Fl_Group).super_Fl_Widget.flags_ & 0x200) != 0)) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    pFVar6 = handle::_lastselect;
    if (pFVar7 != handle::_lastselect) {
      FVar2 = (this->_prefs)._selectmode;
      if (FVar2 == FL_TREE_SELECT_SINGLE_DRAGGABLE) {
        Fl_Widget::redraw((Fl_Widget *)this);
      }
      else {
        pFVar6 = pFVar7;
        if (FVar2 == FL_TREE_SELECT_MULTI) {
          from = next_item(this,handle::_lastselect,iVar8,true);
          extend_selection_dir(this,from,pFVar7,iVar8,((byte)uVar11 & 1) + 1,true);
        }
        else if (FVar2 == FL_TREE_SELECT_SINGLE) {
          select_only(this,pFVar7,(uint)(this->super_Fl_Group).super_Fl_Widget.when_);
        }
      }
    }
    handle::_lastselect = pFVar6;
    return 1;
  }
  return 0;
}

Assistant:

int Fl_Tree::handle(int e) {
  if (e == FL_NO_EVENT) return(0);		// XXX: optimize to prevent slow resizes on large trees!
  int ret = 0;
  char is_shift   = Fl::event_state() & FL_SHIFT   ? 1 : 0;
  char is_ctrl    = Fl::event_state() & FL_CTRL    ? 1 : 0;
  char is_command = Fl::event_state() & FL_COMMAND ? 1 : 0;	// ctrl on win/lin, 'Command' on mac
#if FLTK_ABI_VERSION >= 10301
  // NEW: data inside Fl_Tree
#else /*FLTK_ABI_VERSION*/
  // OLD:
  static Fl_Tree_Item *_lastselect = 0;		// used to extend selections
#endif /*FLTK_ABI_VERSION*/
  // Developer note: Fl_Browser_::handle() used for reference here..
  // #include <FL/names.h>	// for event debugging
  // fprintf(stderr, "DEBUG: %s (%d)\n", fl_eventnames[e], e);

  if (e == FL_ENTER || e == FL_LEAVE) return(1);
  switch (e) {
    case FL_FOCUS: {
      // FLTK tests if we want focus. 
      //     If a nav key was used to give us focus, and we've got no saved
      //     focus widget, determine which item gets focus depending on nav key.
      //
      if ( ! _item_focus ) {				// no focus established yet?
	switch (Fl::event_key()) {			// determine if focus was navigated..
	  case FL_Tab: {				// received focus via TAB?
	    int updown = is_shift ? FL_Up : FL_Down;	// SHIFT-TAB similar to Up, TAB similar to Down
	    set_item_focus(next_visible_item(0, updown));
	    break;
	  }
	  case FL_Left:		// received focus via LEFT or UP?
	  case FL_Up: { 	// XK_ISO_Left_Tab
	    set_item_focus(next_visible_item(0, FL_Up));
	    break;
	  }
	  case FL_Right: 	// received focus via RIGHT or DOWN?
	  case FL_Down:
	  default: {
	    set_item_focus(next_visible_item(0, FL_Down));
	    break;
	  }
	}
      }
      if ( visible_focus() ) redraw();	// draw focus change
      return(1);
    }
    case FL_UNFOCUS: {		// FLTK telling us some other widget took focus.
      if ( visible_focus() ) redraw();	// draw focus change
      return(1);
    }
    case FL_KEYBOARD: {		// keyboard shortcut
      // Do shortcuts first or scrollbar will get them...
      if ( (Fl::focus() == this) &&				// tree has focus?
           _prefs.selectmode() > FL_TREE_SELECT_NONE ) {	// select mode that supports kb events?
	if ( !_item_focus ) {					// no current focus item?
	  set_item_focus(first_visible_item());			// use first vis item
	  if ( Fl::event_key() == FL_Up ||			// Up or down?
	       Fl::event_key() == FL_Down )			// ..if so, already did 'motion'
	    return(1);						// ..so just return.
	}
	if ( _item_focus ) {
	  int ekey = Fl::event_key();
	  switch (ekey) {
	    case FL_Enter:	// ENTER: toggle open/close
	    case FL_KP_Enter: {
	      open_toggle(_item_focus, when());			// toggle item in focus
	      return(1);					// done, we handled key
	    }
	    case ' ':		// SPACE: change selection state
	      switch ( _prefs.selectmode() ) {
		case FL_TREE_SELECT_NONE:
		  break;					// ignore, let group have shot at event
		case FL_TREE_SELECT_SINGLE:
		case FL_TREE_SELECT_SINGLE_DRAGGABLE:
		  if ( is_ctrl ) {				// CTRL-SPACE: (single mode) toggle
		    if ( ! _item_focus->is_selected() ) {
		      select_only(_item_focus, when());
		    } else {
		      deselect_all(0, when());
		    }
		  } else {
		    select_only(_item_focus, when());		// SPACE: (single mode) select only
		  }
		  _lastselect = _item_focus;
	          return(1);					// done, we handled key
		case FL_TREE_SELECT_MULTI:
		  if ( is_ctrl ) {
		    select_toggle(_item_focus, when());		// CTRL-SPACE: (multi mode) toggle selection
		  } else {
		    select(_item_focus, when());		// SPACE: (multi-mode) select
		  }
		  _lastselect = _item_focus;
	          return(1);					// done, we handled key
	      }
	      break;
	    case FL_Right:  	// RIGHT: open children (if any)
	    case FL_Left: {	// LEFT: close children (if any)
	      if ( _item_focus ) {
		if ( ekey == FL_Right && _item_focus->is_close() ) {
		  open(_item_focus);	// open closed item
		  ret = 1;
		} else if ( ekey == FL_Left && _item_focus->is_open() ) {
		  close(_item_focus);	// close open item
		  ret = 1;
		}
		return(1);
	      }
	      break;
	    }
	    case FL_Up:		// UP: next item up, or extend selection up
	    case FL_Down: {	// DOWN: next item down, or extend selection down
	      set_item_focus(next_visible_item(_item_focus, ekey));	// next item up|dn
	      if ( _item_focus ) {					// item in focus?
	        // Autoscroll
		int itemtop = _item_focus->y();
		int itembot = _item_focus->y()+_item_focus->h();
		if ( itemtop < y() ) { show_item_top(_item_focus); }
		if ( itembot > y()+h() ) { show_item_bottom(_item_focus); }
		// Extend selection
		if ( _prefs.selectmode() == FL_TREE_SELECT_MULTI &&	// multiselect on?
		     is_shift &&					// shift key?
		     ! _item_focus->is_selected() ) {			// not already selected?
		  select(_item_focus, when());				// extend selection..
		  _lastselect = _item_focus;
		}
		return(1);
	      }
	      break;
	    }
	    case 'a':
	    case 'A': {
	      if ( is_command ) {					// ^A (win/linux), Meta-A (mac)
		switch ( _prefs.selectmode() ) {
		  case FL_TREE_SELECT_NONE:
		  case FL_TREE_SELECT_SINGLE:
		  case FL_TREE_SELECT_SINGLE_DRAGGABLE:
		    break;
		  case FL_TREE_SELECT_MULTI:
		    // Do a 'select all'
	            select_all();
		    _lastselect = first_visible_item();
		    take_focus();
		    return(1);
		}
	      }
	      break;
	    }
	  }
	}
      }
      break;
    }
  }

  // Let Fl_Group take a shot at handling the event
  if (Fl_Group::handle(e)) {
    return(1);			// handled? don't continue below
  }

  // Handle events the child FLTK widgets didn't need

  // fprintf(stderr, "Fl_Tree::handle(): Event was %s (%d)\n", fl_eventnames[e], e); // DEBUGGING
  if ( ! _root ) return(ret);
  static int last_my = 0;
  switch ( e ) {
    case FL_PUSH: {		// clicked on tree
      last_my = Fl::event_y();	// save for dragging direction..
      if (Fl::visible_focus() && handle(FL_FOCUS)) Fl::focus(this);
#if FLTK_ABI_VERSION >= 10303
      Fl_Tree_Item *item = _root->find_clicked(_prefs, 0);
#else
      Fl_Tree_Item *item = _root->find_clicked(_prefs);
#endif
      if ( !item ) {		// clicked, but not on an item?
        _lastselect = 0;
	switch ( _prefs.selectmode() ) {
	  case FL_TREE_SELECT_NONE:
	    break;
	  case FL_TREE_SELECT_SINGLE:
	  case FL_TREE_SELECT_SINGLE_DRAGGABLE:
	  case FL_TREE_SELECT_MULTI:
	    deselect_all();
	    break;
	}
	break;
      }
      set_item_focus(item);			// becomes new focus widget, calls redraw() if needed
      ret |= 1;					// handled
      if ( Fl::event_button() == FL_LEFT_MOUSE ) {
	if ( item->event_on_collapse_icon(_prefs) ) {	// collapse icon clicked?
	  open_toggle(item);				// toggle open (handles redraw)
	} else if ( item->event_on_label(_prefs) && 	// label clicked?
		 (!item->widget() || !Fl::event_inside(item->widget())) ) {	// not inside widget
	  switch ( _prefs.selectmode() ) {
	    case FL_TREE_SELECT_NONE:
	      break;
	    case FL_TREE_SELECT_SINGLE:
	    case FL_TREE_SELECT_SINGLE_DRAGGABLE:
	      select_only(item, when());		// select only this item (handles redraw)
	      _lastselect = item;
	      break;
	    case FL_TREE_SELECT_MULTI: {
	      if ( is_shift ) {			// SHIFT+PUSH?
	        if ( _lastselect ) {
		  int val = is_ctrl ? 2 : 1;
		  bool visible = true;
#if FLTK_ABI_VERSION >= 10303
	          extend_selection(_lastselect, item, val, visible);
#else
	          extend_selection__(_lastselect, item, val, visible);
#endif
	        } else {
	          select(item);			// add to selection
		}
	      } else if ( is_ctrl ) {		// CTRL+PUSH?
		select_toggle(item, when());	// toggle selection state
	      } else {
		select_only(item, when());
	      }
	      _lastselect = item;
	      break;
	    }
	  }
	}
      }
      break;
    }
    case FL_DRAG: {
      // Do scrolling first..

      // Detect up/down dragging
      int my = Fl::event_y();
      int dir = (my>last_my) ? FL_Down : FL_Up;
      last_my = my;

      // Handle autoscrolling
      if ( my < y() ) {				// Above top?
        dir = FL_Up;				// ..going up
        int p = vposition()-(y()-my);		// ..position above us
	if ( p < 0 ) p = 0;			// ..don't go above 0
        vposition(p);				// ..scroll to new position
      } else if ( my > (y()+h()) ) {		// Below bottom?
        dir = FL_Down;				// ..going down
        int p = vposition()+(my-y()-h());	// ..position below us
	if ( p > (int)_vscroll->maximum() )	// ..don't go below bottom
	  p = (int)_vscroll->maximum();
        vposition(p);				// ..scroll to new position
      }

      // Now handle the event..
      //    During drag, only interested in left-mouse operations.
      //
      if ( Fl::event_button() != FL_LEFT_MOUSE ) break;
#if FLTK_ABI_VERSION >= 10303
      Fl_Tree_Item *item = _root->find_clicked(_prefs, 1); // item we're on, vertically
#else
      Fl_Tree_Item *item = _root->find_clicked(_prefs); // item we're on, vertically
#endif
      if ( !item ) break;			// not near item? ignore drag event
      ret |= 1;					// acknowledge event
      if (_prefs.selectmode() != FL_TREE_SELECT_SINGLE_DRAGGABLE)
        set_item_focus(item);			// becomes new focus item
      if (item==_lastselect) break;		// same item as before? avoid reselect

      // Handle selection behavior
      switch ( _prefs.selectmode() ) {
	case FL_TREE_SELECT_NONE:
	  break;				// no selection changes
	case FL_TREE_SELECT_SINGLE: {
	  select_only(item, when());		// select only this item (handles redraw)
	  break;
	}
	case FL_TREE_SELECT_SINGLE_DRAGGABLE: {
	  item = _lastselect; // Keep the source intact
	  redraw();
	  break;
	}
	case FL_TREE_SELECT_MULTI: {
	  Fl_Tree_Item *from = next_visible_item(_lastselect, dir); // avoid reselecting item
	  Fl_Tree_Item *to = item;
	  int val = is_ctrl ? 2 : 1;	// toggle_select() or just select()?
	  bool visible = true;
	  extend_selection_dir(from, to, dir, val, visible);
	  break;
	}
      }
      _lastselect = item;			// save current item for later
      break;
    }
    case FL_RELEASE:
      if (_prefs.selectmode() == FL_TREE_SELECT_SINGLE_DRAGGABLE &&
          Fl::event_button() == FL_LEFT_MOUSE) {
#if FLTK_ABI_VERSION >= 10303
        Fl_Tree_Item *item = _root->find_clicked(_prefs, 1); // item we're on, vertically
#else
        Fl_Tree_Item *item = _root->find_clicked(_prefs); // item we're on, vertically
#endif

        if (item && _lastselect && item != _lastselect &&
            Fl::event_x() >= item->label_x()) {
          //printf("Would drag '%s' to '%s'\n", _lastselect->label(), item->label());
          // Are we dropping above or below the target item?
          const int h = Fl::event_y() - item->y();
          const int mid = item->h() / 2;
          const bool before = h < mid;
          //printf("Dropping %s it\n", before ? "before" : "after");

          // Do nothing if it would be a no-op
          if ((before && prev(item) != _lastselect) ||
              (!before && next(item) != _lastselect)) {
            Fl_Tree_Item *parent = item->parent();

            if (parent) {
              int pos = parent->find_child(item);
              if (!before)
                pos++;

              // Special case: trying to drop right before a folder
              if (item->children() && item->is_open() && !before) {
                parent = item;
                pos = 0;
              }

              // If we're moving inside the same parent, use the below/above methods
              if (_lastselect->parent() == parent) {
                if (before) {
                  _lastselect->move_above(item);
                } else {
                  _lastselect->move_below(item);
                }
              } else {
                _lastselect->move_into(parent, pos);
              }

              redraw();
              do_callback_for_item(_lastselect, FL_TREE_REASON_DRAGGED);
            }
          }
        }
        redraw();
      } // End single-drag check
      ret |= 1;
      break;
  }
  return(ret);
}